

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

Score * __thiscall xLearn::Solver::create_score(Solver *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Score *pSVar2;
  ostream *poVar3;
  Logger local_6c;
  string local_68;
  string local_48;
  
  if (GetRegistry_xLearn_score_registry()::registry == '\0') {
    create_score();
  }
  std::__cxx11::string::string
            ((string *)&local_68,(this->hyper_param_).score_func._M_dataplus._M_p,
             (allocator *)&local_48);
  pSVar2 = ObjectCreatorRegistry_xLearn_score_registry::CreateObject
                     ((ObjectCreatorRegistry_xLearn_score_registry *)
                      GetRegistry_xLearn_score_registry()::registry,&local_68);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (pSVar2 == (Score *)0x0) {
    local_6c.severity_ = FATAL;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/solver/solver.cc"
               ,"");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"create_score","");
    poVar3 = Logger::Start(FATAL,&local_68,0x56,&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Cannot create score: ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(this->hyper_param_).score_func._M_dataplus._M_p,
               (this->hyper_param_).score_func._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    Logger::~Logger(&local_6c);
  }
  return pSVar2;
}

Assistant:

Score* Solver::create_score() {
  Score* score;
  score = CREATE_SCORE(hyper_param_.score_func.c_str());
  if (score == nullptr) {
    LOG(FATAL) << "Cannot create score: "
               << hyper_param_.score_func;
  }
  return score;
}